

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathBox.h
# Opt level: O2

bool __thiscall
Imath_3_2::Box<Imath_3_2::Vec3<float>_>::isInfinite(Box<Imath_3_2::Vec3<float>_> *this)

{
  undefined1 auVar1 [16];
  undefined4 in_EAX;
  int iVar2;
  
  auVar1._4_4_ = -(uint)((this->min).z != -3.4028235e+38);
  auVar1._0_4_ = -(uint)((this->min).y != -3.4028235e+38);
  auVar1._8_4_ = -(uint)((this->max).x != 3.4028235e+38);
  auVar1._12_4_ = -(uint)((this->max).y != 3.4028235e+38);
  iVar2 = movmskps(in_EAX,auVar1);
  return (bool)(-((this->min).x == -3.4028235e+38) & -((this->max).z == 3.4028235e+38) & iVar2 == 0)
  ;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline bool
Box<Vec3<T>>::isInfinite () const IMATH_NOEXCEPT
{
    if (min.x != std::numeric_limits<T>::lowest () ||
        max.x != std::numeric_limits<T>::max () ||
        min.y != std::numeric_limits<T>::lowest () ||
        max.y != std::numeric_limits<T>::max () ||
        min.z != std::numeric_limits<T>::lowest () ||
        max.z != std::numeric_limits<T>::max ())
        return false;

    return true;
}